

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

void __thiscall IDLExport::closeNamespaces(IDLExport *this,ostream *stream,int levels)

{
  ostream *poVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (0 < levels) {
    do {
      std::__cxx11::string::string
                ((string *)local_50,(string *)&this->m_indent,0,
                 (this->m_indent)._M_string_length - 4);
      std::__cxx11::string::operator=((string *)&this->m_indent,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"};\n",3);
      levels = levels + -1;
    } while (levels != 0);
  }
  return;
}

Assistant:

void IDLExport::closeNamespaces(ostream& stream, int levels)
{
    for (int i = 0; i < levels; ++i)
    {
        m_indent = std::string(m_indent, 0, m_indent.size() - 4);
        stream << "\n" << m_indent << "};\n";
    }
}